

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_assert.cpp
# Opt level: O1

void crnlib_fail(char *pExp,char *pFile,uint line)

{
  bool bVar1;
  char buf [512];
  char acStack_208 [512];
  
  sprintf_s(acStack_208,0x200,"%s(%u): Failure: \"%s\"\n",pFile,(ulong)line,pExp);
  crnlib_output_debug_string(acStack_208);
  fputs(acStack_208,_stderr);
  bVar1 = crnlib_is_debugger_present();
  if (bVar1) {
    crnlib_debug_break();
  }
  exit(1);
}

Assistant:

void crnlib_fail(const char* pExp, const char* pFile, unsigned line)
{
    char buf[512];

    sprintf_s(buf, sizeof(buf), "%s(%u): Failure: \"%s\"\n", pFile, line, pExp);

    crnlib_output_debug_string(buf);

    fputs(buf, stderr);

    if (crnlib_is_debugger_present())
    {
        crnlib_debug_break();
    }

#if CRNLIB_USE_WIN32_API
    if (g_fail_exceptions)
    {
        RaiseException(CRNLIB_FAIL_EXCEPTION_CODE, 0, 0, nullptr);
    }
    else
#endif
    {
        if (g_exit_on_failure)
        {
            exit(EXIT_FAILURE);
        }
    }
}